

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  Type in0;
  MatrixCaseUtils local_74 [12];
  Mat4 local_68;
  VecAccess<float,_4,_3> local_28;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_68,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_68,(float *)sr::(anonymous_namespace)::s_constInMat4x4);
  }
  reduceToVec3(local_74,&local_68);
  local_28.m_vector = &evalCtx->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)local_74);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}